

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O1

qint64 __thiscall
QGregorianCalendar::matchCenturyToWeekday(QGregorianCalendar *this,YearMonthDay *parts,int dow)

{
  int month;
  int day;
  int iVar1;
  int iVar2;
  uint uVar3;
  _Storage<long_long,_true> _Var4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  optional<long_long> oVar8;
  
  iVar6 = parts->year;
  month = parts->month;
  day = parts->day;
  oVar8 = julianFromParts(iVar6,month,day);
  _Var4._M_value =
       oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long>._M_payload;
  if (((undefined1  [16])
       oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (day != 0x1d || month != 2) {
      return -0x8000000000000000;
    }
    uVar3 = iVar6 - (iVar6 >> 0x1f);
    if ((int)uVar3 < 0) {
      iVar6 = uVar3 + 1;
      iVar1 = iVar6 >> 0x1f;
      iVar2 = iVar6 / 100 + iVar1;
      _Var4._0_4_ = (iVar2 - iVar1) - 1;
      _Var4._M_value._4_4_ = 0;
      uVar5 = iVar6 + (iVar2 - iVar1) * -100 + 99;
    }
    else {
      _Var4._M_value = (ulong)uVar3 / 100;
      uVar5 = uVar3 % 100;
    }
    bVar7 = true;
    if (uVar5 == 0) {
      uVar5 = (uint)_Var4._M_value & 3;
      iVar6 = -100;
      if (uVar5 != 1) {
        iVar6 = (4 - uVar5) * 100;
      }
      oVar8 = julianFromParts((iVar6 + uVar3) - (uint)((int)(iVar6 + uVar3) < 1),month,day);
      _Var4._M_value =
           oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      if (((undefined1  [16])
           oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
         ) {
        if (_Var4._M_value < 0) {
          iVar6 = oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
                  super__Optional_payload_base<long_long>._M_payload._0_4_ +
                  (int)((long)(_Var4._M_value + 1U) / 7) * -7 + 7;
        }
        else {
          iVar6 = (int)((ulong)_Var4._M_value / 7) * -7 +
                  oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
                  super__Optional_payload_base<long_long>._M_payload._0_4_;
        }
        bVar7 = iVar6 + 1 != dow;
      }
    }
  }
  else {
    if (_Var4._M_value < 0) {
      iVar2 = oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long>._M_payload._0_4_ +
              (int)((long)(_Var4._M_value + 1U) / 7) * -7 + 7;
    }
    else {
      iVar2 = (int)((ulong)_Var4._M_value / 7) * -7 +
              oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long>._M_payload._0_4_;
    }
    uVar3 = (iVar2 + 1) - dow;
    if (uVar3 == 0) {
      bVar7 = false;
    }
    else {
      _Var4._0_4_ = iVar6 - (iVar6 >> 0x1f);
      _Var4._M_value._4_4_ = 0;
      uVar5 = _Var4._0_4_ - (month < 3);
      if ((int)uVar5 < 0) {
        uVar5 = (int)(uVar5 + 1) / 100 - 1;
      }
      else {
        uVar5 = uVar5 / 100;
      }
      uVar5 = (uVar5 & 3) + uVar3 * 4;
      if ((int)uVar3 < 0) {
        iVar6 = (int)((ulong)((long)(int)(uVar5 + 1) * -0x6db6db6d) >> 0x20) + uVar5 + 1;
        uVar5 = ((iVar6 >> 2) - (iVar6 >> 0x1f)) * -7 + uVar5 + 7;
      }
      else {
        uVar5 = uVar5 % 7;
      }
      bVar7 = true;
      if ((int)uVar5 < 4) {
        if ((int)uVar3 < 0) {
          iVar6 = (int)((ulong)((long)(int)(uVar3 + 1) * -0x6db6db6d) >> 0x20) + uVar3 + 1;
          iVar6 = ((iVar6 >> 2) - (iVar6 >> 0x1f)) + uVar3 + 7;
        }
        else {
          iVar6 = uVar3 / 7 + uVar3;
        }
        iVar6 = _Var4._0_4_ + (iVar6 + 3U >> 1 & 3) * 100 + -100;
        oVar8 = julianFromParts(iVar6 - (uint)(iVar6 < 1),month,day);
        _Var4._M_value =
             oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
        if (((undefined1  [16])
             oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          if (_Var4._M_value < 0) {
            iVar6 = oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
                    super__Optional_payload_base<long_long>._M_payload._0_4_ +
                    (int)((long)(_Var4._M_value + 1U) / 7) * -7 + 7;
          }
          else {
            iVar6 = (int)((ulong)_Var4._M_value / 7) * -7 +
                    oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
                    super__Optional_payload_base<long_long>._M_payload._0_4_;
          }
          bVar7 = iVar6 + 1 != dow;
        }
      }
    }
  }
  if (bVar7) {
    return -0x8000000000000000;
  }
  return _Var4._M_value;
}

Assistant:

qint64
QGregorianCalendar::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    /* The Gregorian four-century cycle is a whole number of weeks long, so we
       only need to consider four centuries, from previous through next-but-one.
       There are thus three days of the week that can't happen, for any given
       day-of-month, month and year-mod-100. (Exception: '00 Feb 29 has only one
       option.)
    */
    auto maybe = julianFromParts(parts.year, parts.month, parts.day);
    if (maybe) {
        int diff = weekDayOfJulian(*maybe) - dow;
        if (!diff)
            return *maybe;
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // What matters is the placement of leap days, so dates before March
        // effectively belong with the dates since the preceding March:
        const auto yearSplit = qDivMod<100>(year - (parts.month < 3 ? 1 : 0));
        const int centuryMod4 = qMod<4>(yearSplit.quotient);
        // Week-day shift for a century is 5, unless crossing a multiple of 400's Feb 29th.
        static_assert(qMod<7>(36524) == 5); // and (3 * 5) % 7 = 1
        // Formulae arrived at by case-by-case analysis of the values of
        // centuryMod4 and diff (and the above clue to multiply by -3 = 4):
        if (qMod<7>(diff * 4 + centuryMod4) < 4) {
            // Century offset maps qMod<7>(diff) in {5, 6} to -1, {3, 4} to +2, and {1, 2} to +1:
            year += (((qMod<7>(diff) + 3) / 2) % 4 - 1) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow)
                return *maybe;
            Q_ASSERT(parts.month == 2 && parts.day == 29
                     && dow != int(Qt::Tuesday) && !(year % 100));
        }

    } else if (parts.month == 2 && parts.day == 29) {
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // Feb 29th on a century needs to resolve to a multiple of 400 years.
        const auto yearSplit = qDivMod<100>(year);
        if (!yearSplit.remainder) {
            const auto centuryMod4 = qMod<4>(yearSplit.quotient);
            Q_ASSERT(centuryMod4); // or we'd have got a valid date to begin with.
            if (centuryMod4 == 1) // round down
                year -= 100;
            else // 2 or 3; round up
                year += (4 - centuryMod4) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow) // (Can only happen for Tuesday.)
                return *maybe;
            Q_ASSERT(dow != int(Qt::Tuesday));
        }
    }
    return (std::numeric_limits<qint64>::min)();
}